

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall QPDF::resolveObjectsInStream(QPDF *this,int obj_stream_number)

{
  qpdf_offset_t end_after_space;
  OffsetBuffer *pOVar1;
  QPDFObjGen og_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  uchar *puVar7;
  qpdf_offset_t qVar8;
  iterator iVar9;
  QPDFExc *pQVar10;
  qpdf_offset_t qVar11;
  uint uVar12;
  long __val;
  pointer ptVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer ptVar14;
  int obj_stream_number_local;
  pointer local_4f8;
  OffsetBuffer *local_4f0;
  int first;
  uint local_4e0;
  int id;
  QPDFObjGen og;
  Buffer obj_buffer;
  uint n;
  size_t local_490;
  string local_488;
  anon_class_16_2_1298170d damaged;
  shared_ptr<Buffer> bp;
  QPDFObjectHandle dict;
  Stream obj_stream;
  vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
  offsets;
  Token tnum;
  Token toffset;
  QPDFObjGen stream_og;
  OffsetBuffer in;
  BufferInputSource input;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  obj_stream_number_local = obj_stream_number;
  damaged.this = this;
  damaged.obj_stream_number = obj_stream_number;
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                    (&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                      resolved_object_streams,&obj_stream_number_local);
  if (sVar5 != 0) {
    return;
  }
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->resolved_object_streams,
             &obj_stream_number_local);
  getObject((QPDF *)&in,(int)this,obj_stream_number_local);
  QPDFObjectHandle::as_stream((QPDFObjectHandle *)&obj_stream,(typed)&in);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in.super_InputSource.last_offset);
  local_4f0 = (OffsetBuffer *)this;
  if (obj_stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::to_string((string *)&tnum,obj_stream_number_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tnum);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input," 0")
    ;
    std::__cxx11::to_string((string *)&obj_buffer,obj_stream_number_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                   "supposed object stream ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj_buffer)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toffset,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                   " is not a stream");
    damagedPDF(pQVar10,(QPDF *)local_4f0,(string *)&in,(string *)&toffset);
    __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  stream_og.obj = obj_stream_number_local;
  stream_og.gen = 0;
  pmVar6 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                        &stream_og);
  qVar11 = pmVar6->end_before_space;
  pmVar6 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                        &stream_og);
  end_after_space = pmVar6->end_after_space;
  ::qpdf::Stream::getDict((Stream *)&dict);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,"/ObjStm",(allocator<char> *)&tnum);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"",(allocator<char> *)&toffset);
  bVar2 = QPDFObjectHandle::isDictionaryOfType(&dict,(string *)&in,(string *)&input);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::~string((string *)&in);
  if (!bVar2) {
    std::__cxx11::to_string((string *)&toffset,obj_stream_number_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tnum,
                   "object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toffset);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tnum," 0");
    std::__cxx11::to_string(&local_488,obj_stream_number_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj_buffer,
                   "supposed object stream ",&local_488);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj_buffer,
                   " has wrong type");
    damagedPDF((QPDFExc *)&in,this,(string *)&input,(string *)&og);
    warn(this,(QPDFExc *)&in);
    QPDFExc::~QPDFExc((QPDFExc *)&in);
    std::__cxx11::string::~string((string *)&og);
    std::__cxx11::string::~string((string *)&obj_buffer);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::string::~string((string *)&tnum);
    std::__cxx11::string::~string((string *)&toffset);
  }
  n = 0;
  first = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&in,"/N",(allocator<char> *)&og);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&tnum,(string *)&dict);
  bVar2 = QPDFObjectHandle::getValueAsUInt((QPDFObjectHandle *)&tnum,&n);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&input,"/First",(allocator<char> *)&obj_buffer);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&toffset,(string *)&dict);
    bVar2 = QPDFObjectHandle::getValueAsInt((QPDFObjectHandle *)&toffset,&first);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&toffset.value);
    std::__cxx11::string::~string((string *)&input);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tnum.value);
    std::__cxx11::string::~string((string *)&in);
    if (bVar2) {
      offsets.
      super__Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      offsets.
      super__Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      offsets.
      super__Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::qpdf::Stream::getStreamData((Stream *)&bp,(qpdf_stream_decode_level_e)&obj_stream);
      std::__cxx11::string::string<std::allocator<char>>((string *)&in,"",(allocator<char> *)&tnum);
      BufferInputSource::BufferInputSource
                (&input,(string *)&in,
                 bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false);
      std::__cxx11::string::~string((string *)&in);
      local_490 = Buffer::getSize(bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      puVar7 = Buffer::getBuffer(bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if ((long)local_490 <= (long)first) {
        pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::__cxx11::to_string((string *)&toffset,obj_stream_number_local);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tnum,
                       "object ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toffset
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tnum,
                       " 0");
        std::__cxx11::to_string(&local_488,obj_stream_number_local);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &obj_buffer,"object stream ",&local_488);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &obj_buffer," has invalid /First entry");
        damagedPDF(pQVar10,(QPDF *)local_4f0,(string *)&in,(string *)&og);
        __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      id = 0;
      uVar12 = 0;
      local_4e0 = (uint)CONCAT71((int7)((ulong)&id >> 8),1);
      local_4f8 = (pointer)0xffffffffffffffff;
      do {
        if (n <= uVar12) {
          if ((local_4e0 & 1) == 0) {
            in.super_InputSource._vptr_InputSource = (_func_int **)((long)local_4f8 + (long)first);
            tnum._0_8_ = local_490 - (long)in.super_InputSource._vptr_InputSource;
            std::
            vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
            ::emplace_back<int&,long_long,unsigned_long>
                      ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                        *)&offsets,&id,(longlong *)&in,(unsigned_long *)&tnum);
          }
          local_4f8 = offsets.
                      super__Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          ptVar14 = offsets.
                    super__Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ptVar13 = offsets.
                         super__Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pOVar1 = local_4f0,
              ptVar13 != ptVar14; ptVar13 = ptVar13 + 1) {
            og.gen = 0;
            og.obj = (ptVar13->super__Tuple_impl<0UL,_int,_long_long,_unsigned_long>).
                     super__Head_base<0UL,_int,_false>._M_head_impl;
            iVar9 = std::
                    _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                    ::find(&(((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                                 *)&(local_4f0->super_InputSource)._vptr_InputSource)->
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              )._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                            xref_table)._M_t,&og);
            if (iVar9._M_node !=
                (_Base_ptr)
                ((long)&((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                            *)&(pOVar1->super_InputSource)._vptr_InputSource)->
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>).
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table +
                8U)) {
              iVar3 = QPDFXRefEntry::getType((QPDFXRefEntry *)&iVar9._M_node[1]._M_parent);
              if ((iVar3 == 2) &&
                 (iVar3 = QPDFXRefEntry::getObjStreamNumber
                                    ((QPDFXRefEntry *)&iVar9._M_node[1]._M_parent),
                 iVar3 == obj_stream_number_local)) {
                Buffer::Buffer(&obj_buffer,
                               puVar7 + (ptVar13->
                                        super__Tuple_impl<0UL,_int,_long_long,_unsigned_long>).
                                        super__Tuple_impl<1UL,_long_long,_unsigned_long>.
                                        super__Head_base<1UL,_long_long,_false>._M_head_impl,
                               (ptVar13->super__Tuple_impl<0UL,_int,_long_long,_unsigned_long>).
                               super__Tuple_impl<1UL,_long_long,_unsigned_long>.
                               super__Tuple_impl<2UL,_unsigned_long>.
                               super__Head_base<2UL,_unsigned_long,_false>._M_head_impl);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&tnum,"",(allocator<char> *)&toffset);
                ::qpdf::is::OffsetBuffer::OffsetBuffer
                          (&in,(string *)&tnum,&obj_buffer,
                           (ptVar13->super__Tuple_impl<0UL,_int,_long_long,_unsigned_long>).
                           super__Tuple_impl<1UL,_long_long,_unsigned_long>.
                           super__Head_base<1UL,_long_long,_false>._M_head_impl);
                std::__cxx11::string::~string((string *)&tnum);
                pOVar1 = local_4f0;
                readObjectInStream((QPDF *)&tnum,local_4f0,(int)&in,obj_stream_number_local);
                og_00 = og;
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&toffset,
                           (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&tnum);
                updateCache((QPDF *)pOVar1,og_00,(shared_ptr<QPDFObject> *)&toffset,qVar11,
                            end_after_space,true);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&toffset.value);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tnum.value);
                BufferInputSource::~BufferInputSource(&in.proxied);
                Buffer::~Buffer(&obj_buffer);
                ptVar14 = local_4f8;
              }
            }
          }
          BufferInputSource::~BufferInputSource(&input);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::
          _Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
          ::~_Vector_base(&offsets.
                           super__Vector_base<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
                         );
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&dict.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&obj_stream.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          return;
        }
        readToken(&tnum,(QPDF *)local_4f0,&input.super_InputSource,0);
        qVar8 = InputSource::getLastOffset(&input.super_InputSource);
        readToken(&toffset,(QPDF *)local_4f0,&input.super_InputSource,0);
        if ((tnum.type != tt_integer) || (toffset.type != tt_integer)) {
          pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
          qVar11 = InputSource::getLastOffset(&input.super_InputSource);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&in,"expected integer in object stream header",(allocator<char> *)&og
                    );
          resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                    (pQVar10,&damaged,0,qVar11,(string *)&in);
          __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        iVar3 = QUtil::string_to_int(tnum.value._M_dataplus._M_p);
        iVar4 = QUtil::string_to_int(toffset.value._M_dataplus._M_p);
        if (iVar3 == obj_stream_number_local) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&og,"object stream claims to contain itself",
                     (allocator<char> *)&obj_buffer);
          resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                    ((QPDFExc *)&in,&damaged,iVar3,qVar8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og);
          warn((QPDF *)local_4f0,(QPDFExc *)&in);
LAB_001e5dd0:
          QPDFExc::~QPDFExc((QPDFExc *)&in);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og;
LAB_001e5ddb:
          std::__cxx11::string::~string((string *)this_00);
          ptVar13 = local_4f8;
        }
        else {
          if (iVar3 < 1) {
            s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                         "object id is invalid",0x14);
            resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                      ((QPDFExc *)&in,&damaged,iVar3,qVar8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og);
            warn((QPDF *)local_4f0,(QPDFExc *)&in);
            goto LAB_001e5dd0;
          }
          __val = (long)iVar4;
          if ((QPDFObjGen)(__val - (long)local_4f8) == (QPDFObjGen)0x0 || __val < (long)local_4f8) {
            qVar8 = InputSource::getLastOffset(&input.super_InputSource);
            std::__cxx11::to_string(&local_70,__val);
            std::operator+(&local_50,"offset ",&local_70);
            std::operator+(&local_488,&local_50," is invalid (must be larger than previous offset ")
            ;
            std::__cxx11::to_string(&local_90,(longlong)local_4f8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &obj_buffer,&local_488,&local_90);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &obj_buffer,")");
            resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                      ((QPDFExc *)&in,&damaged,iVar3,qVar8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og);
            warn((QPDF *)local_4f0,(QPDFExc *)&in);
            QPDFExc::~QPDFExc((QPDFExc *)&in);
            std::__cxx11::string::~string((string *)&og);
            std::__cxx11::string::~string((string *)&obj_buffer);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_50);
            this_00 = &local_70;
            goto LAB_001e5ddb;
          }
          ptVar13 = local_4f8;
          if (iVar3 <= ((((__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                           *)&(local_4f0->super_InputSource)._vptr_InputSource)->
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>).
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                       xref_table_max_id) {
            if ((long)local_490 <= first + __val) {
              qVar8 = InputSource::getLastOffset(&input.super_InputSource);
              std::__cxx11::to_string(&local_488,__val);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &obj_buffer,"offset ",&local_488);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &og,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&obj_buffer," is too large");
              resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                        ((QPDFExc *)&in,&damaged,iVar3,qVar8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og);
              warn((QPDF *)local_4f0,(QPDFExc *)&in);
              QPDFExc::~QPDFExc((QPDFExc *)&in);
              std::__cxx11::string::~string((string *)&og);
              std::__cxx11::string::~string((string *)&obj_buffer);
              this_00 = &local_488;
              goto LAB_001e5ddb;
            }
            ptVar13 = (pointer)__val;
            if ((local_4e0 & 1) == 0) {
              in.super_InputSource._vptr_InputSource = (_func_int **)((long)local_4f8 + (long)first)
              ;
              og = (QPDFObjGen)(__val - (long)local_4f8);
              std::
              vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
              ::emplace_back<int&,long_long,unsigned_long>
                        ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                          *)&offsets,&id,(longlong *)&in,(unsigned_long *)&og);
              id = iVar3;
            }
            else {
              local_4e0 = 0;
              id = iVar3;
            }
          }
        }
        QPDFTokenizer::Token::~Token(&toffset);
        QPDFTokenizer::Token::~Token(&tnum);
        uVar12 = uVar12 + 1;
        local_4f8 = ptVar13;
      } while( true );
    }
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tnum.value);
    std::__cxx11::string::~string((string *)&in);
  }
  pQVar10 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::to_string((string *)&tnum,obj_stream_number_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                 "object ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tnum);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input," 0");
  std::__cxx11::to_string((string *)&obj_buffer,obj_stream_number_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                 "object stream ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj_buffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&toffset,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&og,
                 " has incorrect keys");
  damagedPDF(pQVar10,(QPDF *)local_4f0,(string *)&in,(string *)&toffset);
  __cxa_throw(pQVar10,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::resolveObjectsInStream(int obj_stream_number)
{
    auto damaged =
        [this, obj_stream_number](int id, qpdf_offset_t offset, std::string const& msg) -> QPDFExc {
        return {
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(obj_stream_number),
            +"object " + std::to_string(id) + " 0",
            offset,
            msg,
            true};
    };

    if (m->resolved_object_streams.count(obj_stream_number)) {
        return;
    }
    m->resolved_object_streams.insert(obj_stream_number);
    // Force resolution of object stream
    auto obj_stream = getObject(obj_stream_number, 0).as_stream();
    if (!obj_stream) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " is not a stream");
    }

    // For linearization data in the object, use the data from the object stream for the objects in
    // the stream.
    QPDFObjGen stream_og(obj_stream_number, 0);
    qpdf_offset_t end_before_space = m->obj_cache[stream_og].end_before_space;
    qpdf_offset_t end_after_space = m->obj_cache[stream_og].end_after_space;

    QPDFObjectHandle dict = obj_stream.getDict();
    if (!dict.isDictionaryOfType("/ObjStm")) {
        QTC::TC("qpdf", "QPDF ERR object stream with wrong type");
        warn(damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " has wrong type"));
    }

    unsigned int n{0};
    int first{0};
    if (!(dict.getKey("/N").getValueAsUInt(n) && dict.getKey("/First").getValueAsInt(first))) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has incorrect keys");
    }

    // id, offset, size
    std::vector<std::tuple<int, qpdf_offset_t, size_t>> offsets;

    auto bp = obj_stream.getStreamData(qpdf_dl_specialized);

    BufferInputSource input("", bp.get());

    const auto b_size = bp->getSize();
    const auto end_offset = static_cast<qpdf_offset_t>(b_size);
    auto b_start = bp->getBuffer();

    if (first >= end_offset) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has invalid /First entry");
    }

    int id = 0;
    long long last_offset = -1;
    bool is_first = true;
    for (unsigned int i = 0; i < n; ++i) {
        auto tnum = readToken(input);
        auto id_offset = input.getLastOffset();
        auto toffset = readToken(input);
        if (!(tnum.isInteger() && toffset.isInteger())) {
            throw damaged(0, input.getLastOffset(), "expected integer in object stream header");
        }

        int num = QUtil::string_to_int(tnum.getValue().c_str());
        long long offset = QUtil::string_to_int(toffset.getValue().c_str());

        if (num == obj_stream_number) {
            QTC::TC("qpdf", "QPDF ignore self-referential object stream");
            warn(damaged(num, id_offset, "object stream claims to contain itself"));
            continue;
        }

        if (num < 1) {
            QTC::TC("qpdf", "QPDF object stream contains id < 1");
            warn(damaged(num, id_offset, "object id is invalid"s));
            continue;
        }

        if (offset <= last_offset) {
            QTC::TC("qpdf", "QPDF object stream offsets not increasing");
            warn(damaged(
                num,
                input.getLastOffset(),
                "offset " + std::to_string(offset) +
                    " is invalid (must be larger than previous offset " +
                    std::to_string(last_offset) + ")"));
            continue;
        }

        if (num > m->xref_table_max_id) {
            continue;
        }

        if (first + offset >= end_offset) {
            warn(damaged(
                num, input.getLastOffset(), "offset " + std::to_string(offset) + " is too large"));
            continue;
        }

        if (is_first) {
            is_first = false;
        } else {
            offsets.emplace_back(
                id, last_offset + first, static_cast<size_t>(offset - last_offset));
        }

        last_offset = offset;
        id = num;
    }

    if (!is_first) {
        // We found at least one valid entry.
        offsets.emplace_back(
            id, last_offset + first, b_size - static_cast<size_t>(last_offset + first));
    }

    // To avoid having to read the object stream multiple times, store all objects that would be
    // found here in the cache.  Remember that some objects stored here might have been overridden
    // by new objects appended to the file, so it is necessary to recheck the xref table and only
    // cache what would actually be resolved here.
    for (auto const& [obj_id, obj_offset, obj_size]: offsets) {
        QPDFObjGen og(obj_id, 0);
        auto entry = m->xref_table.find(og);
        if (entry != m->xref_table.end() && entry->second.getType() == 2 &&
            entry->second.getObjStreamNumber() == obj_stream_number) {
            Buffer obj_buffer{b_start + obj_offset, obj_size};
            is::OffsetBuffer in("", &obj_buffer, obj_offset);
            auto oh = readObjectInStream(in, obj_stream_number, obj_id);
            updateCache(og, oh.getObj(), end_before_space, end_after_space);
        } else {
            QTC::TC("qpdf", "QPDF not caching overridden objstm object");
        }
    }
}